

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O2

XrResult LayerTestXrGetInstanceProcAddr(XrInstance instance,char *name,PFN_xrVoidFunction *function)

{
  int iVar1;
  XrResult XVar2;
  iterator iVar3;
  code *pcVar4;
  XrInstance instance_local;
  
  instance_local = instance;
  iVar1 = strcmp(name,"xrGetInstanceProcAddr");
  if (iVar1 == 0) {
    pcVar4 = LayerTestXrGetInstanceProcAddr;
  }
  else {
    iVar1 = strcmp(name,"xrCreateInstance");
    if (iVar1 == 0) {
      pcVar4 = LayerTestXrCreateInstance;
    }
    else {
      iVar1 = strcmp(name,"xrDestroyInstance");
      if (iVar1 != 0) {
        *function = (PFN_xrVoidFunction)0x0;
        iVar3 = std::
                _Rb_tree<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>,_std::_Select1st<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>,_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
                ::find(&g_next_gipa_map._M_t,&instance_local);
        if ((_Rb_tree_header *)iVar3._M_node != &g_next_gipa_map._M_t._M_impl.super__Rb_tree_header)
        {
          XVar2 = (*(code *)iVar3._M_node[1]._M_parent)(instance_local,name,function);
          return XVar2;
        }
        return XR_ERROR_HANDLE_INVALID;
      }
      pcVar4 = LayerTestXrDestroyInstance;
    }
  }
  *function = pcVar4;
  return XR_SUCCESS;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrGetInstanceProcAddr(XrInstance instance, const char *name,
                                                                     PFN_xrVoidFunction *function) {
    if (0 == strcmp(name, "xrGetInstanceProcAddr")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrGetInstanceProcAddr);
    } else if (0 == strcmp(name, "xrCreateInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrCreateInstance);
    } else if (0 == strcmp(name, "xrDestroyInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrDestroyInstance);
    } else {
        *function = nullptr;
    }

    if (*function != nullptr) {
        return XR_SUCCESS;
    }

    // If the function is not intercepted in this layer, call down to the next layer.
    auto it = g_next_gipa_map.find(instance);
    if (it == std::end(g_next_gipa_map)) {
        return XR_ERROR_HANDLE_INVALID;
    }

    return it->second(instance, name, function);
}